

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase1224::run(TestCase1224 *this)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  uint i;
  uint uVar5;
  undefined1 auVar6 [16];
  Orphanage OVar8;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar9;
  uint local_1c0;
  uint local_1bc;
  DebugComparison<int,_unsigned_int> _kjCondition_2;
  ReaderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> reader;
  OrphanBuilder local_168;
  BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> builder;
  MallocMessageBuilder message;
  long lVar7;
  
  MallocMessageBuilder::MallocMessageBuilder(&message,0x400,GROW_HEURISTICALLY);
  OVar8 = MessageBuilder::getOrphanage(&message.super_MessageBuilder);
  OrphanBuilder::initList((OrphanBuilder *)&reader,OVar8.arena,OVar8.capTable,7,FOUR_BYTES);
  local_168.segment = (SegmentBuilder *)reader.reader.capTable;
  local_168.capTable = (CapTableBuilder *)reader.reader.ptr;
  local_168.location = (word *)reader.reader._24_8_;
  OrphanBuilder::asList(&builder.builder,&local_168,FOUR_BYTES);
  auVar1 = _DAT_0028eb20;
  lVar3 = -8;
  uVar4 = 0;
  auVar6 = _DAT_0028eb10;
  do {
    if (SUB164(auVar6 ^ auVar1,4) == -0x80000000 && SUB164(auVar6 ^ auVar1,0) < -0x7ffffff9) {
      *(int *)(builder.builder.ptr + (uVar4 >> 3)) = (int)lVar3 + 0x75bcd1d;
      *(int *)(builder.builder.ptr + (builder.builder.step + uVar4 >> 3)) = (int)lVar3 + 0x75bcd1e;
    }
    lVar7 = auVar6._8_8_;
    auVar6._0_8_ = auVar6._0_8_ + 2;
    auVar6._8_8_ = lVar7 + 2;
    uVar4 = uVar4 + (ulong)builder.builder.step * 2;
    lVar3 = lVar3 + 2;
  } while (lVar3 != 0);
  AVar9 = MessageBuilder::getSegmentsForOutput(&message.super_MessageBuilder);
  reader.reader.capTable = (CapTableReader *)(AVar9.ptr)->size_;
  reader.reader.segment._0_4_ = 5;
  reader.reader.ptr = " == ";
  reader.reader.elementCount = 5;
  reader.reader.step = 0;
  reader.reader.structDataSize._0_1_ = reader.reader.capTable == (CapTableReader *)&DAT_00000005;
  if ((!(bool)(undefined1)reader.reader.structDataSize) && (kj::_::Debug::minSeverity < 3)) {
    local_1c0 = 5;
    AVar9 = MessageBuilder::getSegmentsForOutput(&message.super_MessageBuilder);
    _kjCondition_2._0_8_ = (AVar9.ptr)->size_;
    kj::_::Debug::
    log<char_const(&)[67],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x4d0,ERROR,
               "\"failed: expected \" \"(5) == (message.getSegmentsForOutput()[0].size())\", _kjCondition, 5, message.getSegmentsForOutput()[0].size()"
               ,(char (*) [67])"failed: expected (5) == (message.getSegmentsForOutput()[0].size())",
               (DebugComparison<int,_unsigned_long> *)&reader,(int *)&local_1c0,
               (unsigned_long *)&_kjCondition_2);
  }
  OrphanBuilder::truncate(&local_168,(char *)0xb,4);
  AVar9 = MessageBuilder::getSegmentsForOutput(&message.super_MessageBuilder);
  reader.reader.capTable = (CapTableReader *)(AVar9.ptr)->size_;
  reader.reader.segment._0_4_ = 7;
  reader.reader.ptr = " == ";
  reader.reader.elementCount = 5;
  reader.reader.step = 0;
  reader.reader.structDataSize._0_1_ = reader.reader.capTable == (CapTableReader *)&DAT_00000007;
  if ((!(bool)(undefined1)reader.reader.structDataSize) && (kj::_::Debug::minSeverity < 3)) {
    local_1c0 = 7;
    AVar9 = MessageBuilder::getSegmentsForOutput(&message.super_MessageBuilder);
    _kjCondition_2._0_8_ = (AVar9.ptr)->size_;
    kj::_::Debug::
    log<char_const(&)[67],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x4d2,ERROR,
               "\"failed: expected \" \"(7) == (message.getSegmentsForOutput()[0].size())\", _kjCondition, 7, message.getSegmentsForOutput()[0].size()"
               ,(char (*) [67])"failed: expected (7) == (message.getSegmentsForOutput()[0].size())",
               (DebugComparison<int,_unsigned_long> *)&reader,(int *)&local_1c0,
               (unsigned_long *)&_kjCondition_2);
  }
  OrphanBuilder::asListReader(&reader.reader,&local_168,FOUR_BYTES);
  _kjCondition_2.right = reader.reader.elementCount;
  _kjCondition_2.left = 0xb;
  _kjCondition_2.op.content.ptr = " == ";
  _kjCondition_2.op.content.size_ = 5;
  _kjCondition_2.result = reader.reader.elementCount == 0xb;
  if ((!_kjCondition_2.result) && (kj::_::Debug::minSeverity < 3)) {
    local_1c0 = 0xb;
    local_1bc = reader.reader.elementCount;
    kj::_::Debug::log<char_const(&)[41],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x4d5,ERROR,
               "\"failed: expected \" \"(11) == (reader.size())\", _kjCondition, 11, reader.size()",
               (char (*) [41])"failed: expected (11) == (reader.size())",&_kjCondition_2,
               (int *)&local_1c0,&local_1bc);
  }
  uVar4 = 0x75bcd15;
  do {
    uVar2 = ((ulong)reader.reader._24_8_ >> 0x20) * (uVar4 - 0x75bcd15) >> 3;
    _kjCondition_2.result = uVar4 == *(uint *)(reader.reader.ptr + uVar2);
    uVar5 = (uint)uVar4;
    _kjCondition_2.right = *(uint *)(reader.reader.ptr + uVar2);
    _kjCondition_2.left = uVar5;
    _kjCondition_2.op.content.ptr = " == ";
    _kjCondition_2.op.content.size_ = 5;
    if (kj::_::Debug::minSeverity < 3 && !_kjCondition_2.result) {
      local_1bc = *(uint *)(reader.reader.ptr + uVar2);
      local_1c0 = uVar5;
      kj::_::Debug::
      log<char_const(&)[48],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x4d8,ERROR,
                 "\"failed: expected \" \"(123456789 + i) == (reader[i])\", _kjCondition, 123456789 + i, reader[i]"
                 ,(char (*) [48])"failed: expected (123456789 + i) == (reader[i])",
                 (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_2,&local_1c0,
                 &local_1bc);
    }
    uVar2 = (uVar4 - 0x75bcd15) * (ulong)builder.builder.step >> 3;
    _kjCondition_2.right = *(uint *)(builder.builder.ptr + uVar2);
    _kjCondition_2.op.content.ptr = " == ";
    _kjCondition_2.op.content.size_ = 5;
    _kjCondition_2.result = uVar4 == *(uint *)(builder.builder.ptr + uVar2);
    if ((!_kjCondition_2.result) && (kj::_::Debug::minSeverity < 3)) {
      local_1bc = *(uint *)(builder.builder.ptr + uVar2);
      local_1c0 = uVar5;
      kj::_::Debug::
      log<char_const(&)[49],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x4d9,ERROR,
                 "\"failed: expected \" \"(123456789 + i) == (builder[i])\", _kjCondition, 123456789 + i, builder[i]"
                 ,(char (*) [49])"failed: expected (123456789 + i) == (builder[i])",
                 (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_2,&local_1c0,
                 &local_1bc);
    }
    uVar4 = uVar4 + 1;
  } while (uVar4 != 0x75bcd1c);
  lVar3 = 7;
  do {
    uVar4 = ((ulong)reader.reader._24_8_ >> 0x20) * lVar3 >> 3;
    _kjCondition_2._0_8_ = (ulong)*(uint *)(reader.reader.ptr + uVar4) << 0x20;
    _kjCondition_2.op.content.ptr = " == ";
    _kjCondition_2.op.content.size_ = 5;
    _kjCondition_2.result = *(uint *)(reader.reader.ptr + uVar4) == 0;
    if ((!_kjCondition_2.result) && (kj::_::Debug::minSeverity < 3)) {
      local_1c0 = 0;
      local_1bc = *(uint *)(reader.reader.ptr + uVar4);
      kj::_::Debug::
      log<char_const(&)[36],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x4dc,ERROR,
                 "\"failed: expected \" \"(0) == (reader[i])\", _kjCondition, 0, reader[i]",
                 (char (*) [36])"failed: expected (0) == (reader[i])",&_kjCondition_2,
                 (int *)&local_1c0,&local_1bc);
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0xb);
  builder.builder.ptr[0] = 'A';
  builder.builder.ptr[1] = '\x01';
  builder.builder.ptr[2] = '\0';
  builder.builder.ptr[3] = '\0';
  _kjCondition_2.right = *(uint *)reader.reader.ptr;
  _kjCondition_2.left = 0x141;
  _kjCondition_2.op.content.ptr = " == ";
  _kjCondition_2.op.content.size_ = 5;
  _kjCondition_2.result = _kjCondition_2.right == 0x141;
  if ((!_kjCondition_2.result) && (kj::_::Debug::minSeverity < 3)) {
    local_1c0 = 0x141;
    local_1bc = _kjCondition_2.right;
    kj::_::Debug::log<char_const(&)[38],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x4e2,ERROR,
               "\"failed: expected \" \"(321) == (reader[0])\", _kjCondition, 321, reader[0]",
               (char (*) [38])"failed: expected (321) == (reader[0])",&_kjCondition_2,
               (int *)&local_1c0,&local_1bc);
  }
  if (local_168.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_168);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&message);
  return;
}

Assistant:

TEST(Orphans, ExtendPrimitiveList) {
  MallocMessageBuilder message;
  auto orphan = message.getOrphanage().newOrphan<List<uint32_t>>(7);
  auto builder = orphan.get();
  for (uint i = 0; i < 7; i++) {
    builder.set(i, 123456789 + i);
  }

  EXPECT_EQ(5, message.getSegmentsForOutput()[0].size());
  orphan.truncate(11);
  EXPECT_EQ(7, message.getSegmentsForOutput()[0].size());

  auto reader = orphan.getReader();
  EXPECT_EQ(11, reader.size());

  for (uint i = 0; i < 7; i++) {
    EXPECT_EQ(123456789 + i, reader[i]);
    EXPECT_EQ(123456789 + i, builder[i]);
  }
  for (uint i = 7; i < 11; i++) {
    EXPECT_EQ(0, reader[i]);
  }

  // Can't compare pointers directly, but we can check if builder modifications are visible using
  // the reader.
  builder.set(0, 321);
  EXPECT_EQ(321, reader[0]);
}